

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pjpeg-idct.c
# Opt level: O3

void pjpeg_idct_2D_double(int32_t *in,uint8_t *out,uint32_t outstride)

{
  undefined1 auVar1 [16];
  double dVar2;
  long lVar3;
  int x;
  long lVar4;
  int u_1;
  int iVar5;
  int u;
  ulong uVar6;
  double *pdVar7;
  undefined1 *puVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double tmp [64];
  double dout [64];
  double din [64];
  double local_638 [64];
  undefined1 local_438 [512];
  double local_238 [65];
  
  lVar3 = 0;
  do {
    dVar10 = (double)(int)((ulong)*(undefined8 *)(in + lVar3) >> 0x20);
    auVar1._8_4_ = SUB84(dVar10,0);
    auVar1._0_8_ = (double)(int)*(undefined8 *)(in + lVar3);
    auVar1._12_4_ = (int)((ulong)dVar10 >> 0x20);
    *(undefined1 (*) [16])(local_238 + lVar3) = auVar1;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x40);
  pdVar7 = local_638;
  lVar3 = 0;
  do {
    local_638[lVar3 * 8 + 6] = 0.0;
    local_638[lVar3 * 8 + 7] = 0.0;
    local_638[lVar3 * 8 + 4] = 0.0;
    local_638[lVar3 * 8 + 5] = 0.0;
    local_638[lVar3 * 8 + 2] = 0.0;
    local_638[lVar3 * 8 + 3] = 0.0;
    local_638[lVar3 * 8] = 0.0;
    local_638[lVar3 * 8 + 1] = 0.0;
    iVar5 = 0;
    uVar6 = 0;
    dVar10 = 0.7071067811865475;
    do {
      dVar11 = local_238[lVar3 * 8 + uVar6];
      if ((dVar11 != 0.0) || (NAN(dVar11))) {
        uVar9 = uVar6 & 0xffffffff;
        lVar4 = 0;
        do {
          dVar2 = cos((double)(int)uVar9 * 3.141592653589793 * 0.0625);
          pdVar7[lVar4] = dVar2 * dVar10 * dVar11 + pdVar7[lVar4];
          lVar4 = lVar4 + 1;
          uVar9 = (ulong)(uint)((int)uVar9 + iVar5);
        } while (lVar4 != 8);
      }
      uVar6 = uVar6 + 1;
      iVar5 = iVar5 + 2;
      dVar10 = 1.0;
    } while (uVar6 != 8);
    lVar3 = lVar3 + 1;
    pdVar7 = pdVar7 + 8;
  } while (lVar3 != 8);
  puVar8 = local_438;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined8 *)(puVar8 + lVar4) = 0;
      lVar4 = lVar4 + 0x40;
    } while (lVar4 != 0x200);
    iVar5 = 0;
    uVar6 = 0;
    dVar10 = 0.7071067811865475;
    do {
      dVar11 = local_638[lVar3 + uVar6 * 8];
      if ((dVar11 != 0.0) || (NAN(dVar11))) {
        uVar9 = uVar6 & 0xffffffff;
        lVar4 = 0;
        do {
          dVar2 = cos((double)(int)uVar9 * 3.141592653589793 * 0.0625);
          *(double *)(puVar8 + lVar4) = dVar2 * dVar10 * dVar11 + *(double *)(puVar8 + lVar4);
          lVar4 = lVar4 + 0x40;
          uVar9 = (ulong)(uint)((int)uVar9 + iVar5);
        } while (lVar4 != 0x200);
      }
      uVar6 = uVar6 + 1;
      iVar5 = iVar5 + 2;
      dVar10 = 1.0;
    } while (uVar6 != 8);
    lVar3 = lVar3 + 1;
    puVar8 = puVar8 + 8;
  } while (lVar3 != 8);
  puVar8 = local_438;
  iVar5 = 0;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      dVar11 = *(double *)(puVar8 + lVar4 * 8) * 0.25 + 128.0;
      dVar10 = 0.0;
      if (0.0 <= dVar11) {
        dVar10 = dVar11;
      }
      dVar11 = 255.0;
      if (dVar10 <= 255.0) {
        dVar11 = dVar10;
      }
      *(double *)(puVar8 + lVar4 * 8) = dVar11;
      out[(uint)(iVar5 + (int)lVar4)] = (uint8_t)(int)dVar11;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    lVar3 = lVar3 + 1;
    iVar5 = iVar5 + outstride;
    puVar8 = puVar8 + 0x40;
  } while (lVar3 != 8);
  return;
}

Assistant:

void pjpeg_idct_2D_double(int32_t in[64], uint8_t *out, uint32_t outstride)
{
    double din[64], dout[64];
    for (int i = 0; i < 64; i++)
        din[i] = in[i];

    double tmp[64];

    // idct on rows
    for (int y = 0; y < 8; y++)
        idct_1D_double(&din[8*y], 1, &tmp[8*y], 1);

    // idct on columns
    for (int x = 0; x < 8; x++)
        idct_1D_double(&tmp[x], 8, &dout[x], 8);

    // scale, adjust bias, and clamp
    for (int y = 0; y < 8; y++) {
        for (int x = 0; x < 8; x++) {
            int i = 8*y + x;

            dout[i] = (dout[i] / 4) + 128;
            if (dout[i] < 0)
                dout[i] = 0;
            if (dout[i] > 255)
                dout[i] = 255;

            // XXX round by adding +.5?
            out[y*outstride + x] = dout[i];
        }
    }
}